

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

EdgeIter __thiscall CMU462::HalfedgeMesh::newEdge(HalfedgeMesh *this)

{
  Edge local_88;
  iterator local_28;
  const_iterator local_20;
  HalfedgeMesh *local_18;
  HalfedgeMesh *this_local;
  
  local_18 = this;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::end(&this->edges);
  std::_List_const_iterator<CMU462::Edge>::_List_const_iterator(&local_20,&local_28);
  local_88.record.score = 0.0;
  local_88._halfedge._M_node = (_List_node_base *)0x0;
  local_88.record.optimalPoint.y = 0.0;
  local_88.record.optimalPoint.z = 0.0;
  local_88.record.edge._M_node = (_List_node_base *)0x0;
  local_88.record.optimalPoint.x = 0.0;
  local_88.index = 0;
  local_88.isNew = false;
  local_88._41_7_ = 0;
  local_88.newPosition.y = 0.0;
  local_88.newPosition.z = 0.0;
  local_88.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)0x0;
  local_88.newPosition.x = 0.0;
  Edge::Edge(&local_88);
  this_local = (HalfedgeMesh *)
               std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::insert
                         (&this->edges,local_20,&local_88);
  Edge::~Edge(&local_88);
  return (EdgeIter)(_List_node_base *)this_local;
}

Assistant:

EdgeIter newEdge() { return edges.insert(edges.end(), Edge()); }